

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase583::run(TestCase583 *this)

{
  PathPtr fromPath;
  bool bVar1;
  int iVar2;
  String *pSVar3;
  File *pFVar4;
  Directory *pDVar5;
  RefOrVoid<kj::Directory> fromDirectory;
  ReadableFile *pRVar6;
  Replacer<kj::File> *pRVar7;
  undefined4 extraout_var;
  PathPtr path;
  PathPtr path_00;
  PathPtr path_01;
  PathPtr path_02;
  PathPtr path_03;
  PathPtr path_04;
  bool local_3c1;
  undefined1 local_3c0 [7];
  bool _kj_shouldLog_3;
  ArrayPtr<const_char> local_3b0;
  Path local_3a0;
  PathPtr local_388;
  Own<const_kj::ReadableFile> local_378;
  String local_368;
  bool local_349;
  undefined1 local_348 [7];
  bool _kj_shouldLog_2;
  ArrayPtr<const_char> local_338;
  Path local_328;
  PathPtr local_310;
  Own<const_kj::ReadableFile> local_300;
  String local_2f0;
  ArrayPtr<const_char> local_2d8;
  ArrayPtr<const_char> local_2c8;
  Path local_2b8;
  PathPtr local_2a0;
  undefined1 local_290 [8];
  Own<kj::Directory::Replacer<kj::File>_> replacer;
  undefined1 local_278 [7];
  bool _kj_shouldLog_1;
  ArrayPtr<const_char> local_268;
  Path local_258;
  PathPtr local_240;
  Own<const_kj::ReadableFile> local_230;
  String local_220;
  ArrayPtr<const_char> local_208;
  ArrayPtr<const_char> local_1f8;
  Path local_1e8;
  PathPtr local_1d0;
  Own<const_kj::File> local_1c0;
  bool local_1a9;
  undefined1 local_1a8 [7];
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_198;
  Path local_188;
  PathPtr local_170;
  Own<const_kj::ReadableFile> local_160;
  String local_150;
  ArrayPtr<const_char> local_138;
  Path local_128;
  PathPtr local_110;
  ArrayPtr<const_char> local_100;
  Path local_f0;
  ArrayPtr<const_kj::String> local_d8;
  ArrayPtr<const_char> local_c8;
  ArrayPtr<const_char> local_b8;
  Path local_a8;
  PathPtr local_90;
  Own<const_kj::File> local_80;
  undefined1 local_70 [8];
  Own<kj::Directory> dst;
  Own<kj::Directory> src;
  undefined1 local_40 [8];
  TempDir tempDirDst;
  TempDir tempDirSrc;
  TestCase583 *this_local;
  
  TempDir::TempDir((TempDir *)&tempDirDst.filename.content.disposer);
  TempDir::TempDir((TempDir *)local_40);
  TempDir::get((TempDir *)&dst.ptr);
  TempDir::get((TempDir *)local_70);
  pSVar3 = (String *)Own<kj::Directory>::operator->((Own<kj::Directory> *)&dst.ptr);
  StringPtr::StringPtr((StringPtr *)&local_b8,"foo");
  Path::Path(&local_a8,(StringPtr)local_b8);
  PathPtr::PathPtr(&local_90,&local_a8);
  operator|(CREATE,CREATE_PARENT);
  path.parts.size_ = (size_t)local_90.parts.ptr;
  path.parts.ptr = pSVar3;
  Directory::openFile((Directory *)&local_80,path,(WriteMode)local_90.parts.size_);
  pFVar4 = Own<const_kj::File>::operator->(&local_80);
  StringPtr::StringPtr((StringPtr *)&local_c8,"foobar");
  File::writeAll(pFVar4,(StringPtr)local_c8);
  Own<const_kj::File>::~Own(&local_80);
  Path::~Path(&local_a8);
  pDVar5 = Own<kj::Directory>::operator->((Own<kj::Directory> *)local_70);
  StringPtr::StringPtr((StringPtr *)&local_100,"link");
  Path::Path(&local_f0,(StringPtr)local_100);
  PathPtr::PathPtr((PathPtr *)&local_d8,&local_f0);
  fromDirectory = Own<kj::Directory>::operator*((Own<kj::Directory> *)&dst.ptr);
  StringPtr::StringPtr((StringPtr *)&local_138,"foo");
  Path::Path(&local_128,(StringPtr)local_138);
  PathPtr::PathPtr(&local_110,&local_128);
  fromPath.parts.size_ = local_110.parts.size_;
  fromPath.parts.ptr = local_110.parts.ptr;
  Directory::transfer(pDVar5,(PathPtr)local_d8,CREATE,fromDirectory,fromPath,LINK);
  Path::~Path(&local_128);
  Path::~Path(&local_f0);
  pSVar3 = (String *)Own<kj::Directory>::operator->((Own<kj::Directory> *)local_70);
  StringPtr::StringPtr((StringPtr *)&local_198,"link");
  Path::Path(&local_188,(StringPtr)local_198);
  PathPtr::PathPtr(&local_170,&local_188);
  path_00.parts.size_ = (size_t)local_170.parts.ptr;
  path_00.parts.ptr = pSVar3;
  ReadableDirectory::openFile((ReadableDirectory *)&local_160,path_00);
  pRVar6 = Own<const_kj::ReadableFile>::operator->(&local_160);
  ReadableFile::readAllText(&local_150,pRVar6);
  StringPtr::StringPtr((StringPtr *)local_1a8,"foobar");
  bVar1 = String::operator==(&local_150,(StringPtr *)local_1a8);
  String::~String(&local_150);
  Own<const_kj::ReadableFile>::~Own(&local_160);
  Path::~Path(&local_188);
  if (!bVar1) {
    local_1a9 = _::Debug::shouldLog(ERROR);
    while (local_1a9 != false) {
      _::Debug::log<char_const(&)[72]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
                 ,0x253,ERROR,
                 "\"failed: expected \" \"dst->openFile(Path(\\\"link\\\"))->readAllText() == \\\"foobar\\\"\""
                 ,(char (*) [72])
                  "failed: expected dst->openFile(Path(\"link\"))->readAllText() == \"foobar\"");
      local_1a9 = false;
    }
  }
  pSVar3 = (String *)Own<kj::Directory>::operator->((Own<kj::Directory> *)&dst.ptr);
  StringPtr::StringPtr((StringPtr *)&local_1f8,"foo");
  Path::Path(&local_1e8,(StringPtr)local_1f8);
  PathPtr::PathPtr(&local_1d0,&local_1e8);
  path_01.parts.size_ = (size_t)local_1d0.parts.ptr;
  path_01.parts.ptr = pSVar3;
  Directory::openFile((Directory *)&local_1c0,path_01,(WriteMode)local_1d0.parts.size_);
  pFVar4 = Own<const_kj::File>::operator->(&local_1c0);
  StringPtr::StringPtr((StringPtr *)&local_208,"bazqux");
  File::writeAll(pFVar4,(StringPtr)local_208);
  Own<const_kj::File>::~Own(&local_1c0);
  Path::~Path(&local_1e8);
  pSVar3 = (String *)Own<kj::Directory>::operator->((Own<kj::Directory> *)local_70);
  StringPtr::StringPtr((StringPtr *)&local_268,"link");
  Path::Path(&local_258,(StringPtr)local_268);
  PathPtr::PathPtr(&local_240,&local_258);
  path_02.parts.size_ = (size_t)local_240.parts.ptr;
  path_02.parts.ptr = pSVar3;
  ReadableDirectory::openFile((ReadableDirectory *)&local_230,path_02);
  pRVar6 = Own<const_kj::ReadableFile>::operator->(&local_230);
  ReadableFile::readAllText(&local_220,pRVar6);
  StringPtr::StringPtr((StringPtr *)local_278,"bazqux");
  bVar1 = String::operator==(&local_220,(StringPtr *)local_278);
  String::~String(&local_220);
  Own<const_kj::ReadableFile>::~Own(&local_230);
  Path::~Path(&local_258);
  if (!bVar1) {
    replacer.ptr._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)replacer.ptr._7_1_ != false) {
      _::Debug::log<char_const(&)[72]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
                 ,599,ERROR,
                 "\"failed: expected \" \"dst->openFile(Path(\\\"link\\\"))->readAllText() == \\\"bazqux\\\"\""
                 ,(char (*) [72])
                  "failed: expected dst->openFile(Path(\"link\"))->readAllText() == \"bazqux\"");
      replacer.ptr._7_1_ = false;
    }
  }
  pDVar5 = Own<kj::Directory>::operator->((Own<kj::Directory> *)&dst.ptr);
  StringPtr::StringPtr((StringPtr *)&local_2c8,"foo");
  Path::Path(&local_2b8,(StringPtr)local_2c8);
  PathPtr::PathPtr(&local_2a0,&local_2b8);
  (*(pDVar5->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xe])
            (local_290,pDVar5,local_2a0.parts.ptr,local_2a0.parts.size_,2);
  Path::~Path(&local_2b8);
  pRVar7 = Own<kj::Directory::Replacer<kj::File>_>::operator->
                     ((Own<kj::Directory::Replacer<kj::File>_> *)local_290);
  iVar2 = (**pRVar7->_vptr_Replacer)();
  StringPtr::StringPtr((StringPtr *)&local_2d8,"corge");
  File::writeAll((File *)CONCAT44(extraout_var,iVar2),(StringPtr)local_2d8);
  pRVar7 = Own<kj::Directory::Replacer<kj::File>_>::operator->
                     ((Own<kj::Directory::Replacer<kj::File>_> *)local_290);
  Directory::Replacer<kj::File>::commit(pRVar7);
  Own<kj::Directory::Replacer<kj::File>_>::~Own
            ((Own<kj::Directory::Replacer<kj::File>_> *)local_290);
  pSVar3 = (String *)Own<kj::Directory>::operator->((Own<kj::Directory> *)&dst.ptr);
  StringPtr::StringPtr((StringPtr *)&local_338,"foo");
  Path::Path(&local_328,(StringPtr)local_338);
  PathPtr::PathPtr(&local_310,&local_328);
  path_03.parts.size_ = (size_t)local_310.parts.ptr;
  path_03.parts.ptr = pSVar3;
  ReadableDirectory::openFile((ReadableDirectory *)&local_300,path_03);
  pRVar6 = Own<const_kj::ReadableFile>::operator->(&local_300);
  ReadableFile::readAllText(&local_2f0,pRVar6);
  StringPtr::StringPtr((StringPtr *)local_348,"corge");
  bVar1 = String::operator==(&local_2f0,(StringPtr *)local_348);
  String::~String(&local_2f0);
  Own<const_kj::ReadableFile>::~Own(&local_300);
  Path::~Path(&local_328);
  if (!bVar1) {
    local_349 = _::Debug::shouldLog(ERROR);
    while (local_349 != false) {
      _::Debug::log<char_const(&)[70]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
                 ,0x25f,ERROR,
                 "\"failed: expected \" \"src->openFile(Path(\\\"foo\\\"))->readAllText() == \\\"corge\\\"\""
                 ,(char (*) [70])
                  "failed: expected src->openFile(Path(\"foo\"))->readAllText() == \"corge\"");
      local_349 = false;
    }
  }
  pSVar3 = (String *)Own<kj::Directory>::operator->((Own<kj::Directory> *)local_70);
  StringPtr::StringPtr((StringPtr *)&local_3b0,"link");
  Path::Path(&local_3a0,(StringPtr)local_3b0);
  PathPtr::PathPtr(&local_388,&local_3a0);
  path_04.parts.size_ = (size_t)local_388.parts.ptr;
  path_04.parts.ptr = pSVar3;
  ReadableDirectory::openFile((ReadableDirectory *)&local_378,path_04);
  pRVar6 = Own<const_kj::ReadableFile>::operator->(&local_378);
  ReadableFile::readAllText(&local_368,pRVar6);
  StringPtr::StringPtr((StringPtr *)local_3c0,"bazqux");
  bVar1 = String::operator==(&local_368,(StringPtr *)local_3c0);
  String::~String(&local_368);
  Own<const_kj::ReadableFile>::~Own(&local_378);
  Path::~Path(&local_3a0);
  if (!bVar1) {
    local_3c1 = _::Debug::shouldLog(ERROR);
    while (local_3c1 != false) {
      _::Debug::log<char_const(&)[72]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
                 ,0x260,ERROR,
                 "\"failed: expected \" \"dst->openFile(Path(\\\"link\\\"))->readAllText() == \\\"bazqux\\\"\""
                 ,(char (*) [72])
                  "failed: expected dst->openFile(Path(\"link\"))->readAllText() == \"bazqux\"");
      local_3c1 = false;
    }
  }
  Own<kj::Directory>::~Own((Own<kj::Directory> *)local_70);
  Own<kj::Directory>::~Own((Own<kj::Directory> *)&dst.ptr);
  TempDir::~TempDir((TempDir *)local_40);
  TempDir::~TempDir((TempDir *)&tempDirDst.filename.content.disposer);
  return;
}

Assistant:

TEST(Async, Canceler) {
  EventLoop loop;
  WaitScope waitScope(loop);
  Canceler canceler;

  auto never = canceler.wrap(kj::Promise<void>(kj::NEVER_DONE));
  auto now = canceler.wrap(kj::Promise<void>(kj::READY_NOW));
  auto neverI = canceler.wrap(kj::Promise<void>(kj::NEVER_DONE).then([]() { return 123u; }));
  auto nowI = canceler.wrap(kj::Promise<uint>(123u));

  KJ_EXPECT(!never.poll(waitScope));
  KJ_EXPECT(now.poll(waitScope));
  KJ_EXPECT(!neverI.poll(waitScope));
  KJ_EXPECT(nowI.poll(waitScope));

  canceler.cancel("foobar");

  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("foobar", never.wait(waitScope));
  now.wait(waitScope);
  KJ_EXPECT_THROW_MESSAGE("foobar", neverI.wait(waitScope));
  KJ_EXPECT(nowI.wait(waitScope) == 123u);
}